

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDU_Factory.cpp
# Opt level: O2

void __thiscall KDIS::UTILS::PDU_Factory::RemoveFilter(PDU_Factory *this,PDU_Factory_Filter *F)

{
  PDU_Factory_Filter **ppPVar1;
  const_iterator __position;
  
  ppPVar1 = (this->m_vFilters).
            super__Vector_base<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (__position._M_current =
            (this->m_vFilters).
            super__Vector_base<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
            ._M_impl.super__Vector_impl_data._M_start; __position._M_current != ppPVar1;
      __position._M_current = __position._M_current + 1) {
    if (*__position._M_current == F) {
      __position._M_current =
           (PDU_Factory_Filter **)
           std::
           vector<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
           ::erase(&this->m_vFilters,__position);
    }
  }
  return;
}

Assistant:

void PDU_Factory::RemoveFilter( PDU_Factory_Filter * F )
{
    // Check for filter and remove it if we find it.
    vector<PDU_Factory_Filter*>::iterator itr = m_vFilters.begin();
    vector<PDU_Factory_Filter*>::iterator itrEnd = m_vFilters.end();
    for( ; itr != itrEnd; ++itr )
    {
        if( (*itr) == F )
        {
            itr = m_vFilters.erase( itr );
        }
    }
}